

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksplitter.c
# Opt level: O3

void ZopfliBlockSplit(ZopfliOptions *options,uchar *in,size_t instart,size_t inend,size_t maxblocks,
                     size_t **splitpoints,size_t *npoints)

{
  size_t sVar1;
  size_t *__ptr;
  size_t **ppsVar2;
  size_t sVar3;
  size_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t nlz77points;
  ZopfliLZ77Store store;
  ZopfliBlockState s;
  ZopfliHash hash;
  size_t *local_100;
  size_t **local_f8;
  size_t local_f0;
  size_t local_e8;
  ZopfliLZ77Store local_e0;
  ZopfliBlockState local_98;
  ZopfliHash local_78;
  
  local_100 = (size_t *)0x0;
  local_e8 = 0;
  local_f0 = maxblocks;
  ZopfliInitLZ77Store(in,&local_e0);
  ZopfliInitBlockState(options,instart,inend,0,&local_98);
  ZopfliAllocHash(0x8000,&local_78);
  *npoints = 0;
  *splitpoints = (size_t *)0x0;
  local_f8 = splitpoints;
  ZopfliLZ77Greedy(&local_98,in,instart,inend,&local_e0,&local_78);
  ZopfliBlockSplitLZ77(options,&local_e0,local_f0,&local_100,&local_e8);
  sVar3 = local_e8;
  ppsVar2 = local_f8;
  __ptr = local_100;
  if ((local_e8 != 0) && (local_e0.size != 0)) {
    uVar7 = 0;
    uVar5 = local_e0.size;
    do {
      if (local_e0.dists[uVar7] == 0) {
        uVar6 = 1;
      }
      else {
        uVar6 = (ulong)local_e0.litlens[uVar7];
      }
      uVar8 = *npoints;
      if (uVar7 == __ptr[uVar8]) {
        if ((uVar8 & uVar8 - 1) == 0) {
          if (uVar8 == 0) {
            psVar4 = (size_t *)malloc(8);
            uVar8 = 0;
          }
          else {
            psVar4 = (size_t *)realloc(*ppsVar2,uVar8 << 4);
            uVar8 = *npoints;
          }
          *ppsVar2 = psVar4;
        }
        else {
          psVar4 = *ppsVar2;
        }
        psVar4[uVar8] = instart;
        sVar1 = *npoints;
        *npoints = sVar1 + 1;
        uVar5 = local_e0.size;
        if (sVar1 + 1 == sVar3) break;
      }
      instart = instart + uVar6;
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar5);
  }
  free(__ptr);
  ZopfliCleanBlockState(&local_98);
  ZopfliCleanLZ77Store(&local_e0);
  ZopfliCleanHash(&local_78);
  return;
}

Assistant:

void ZopfliBlockSplit(const ZopfliOptions* options,
                      const unsigned char* in, size_t instart, size_t inend,
                      size_t maxblocks, size_t** splitpoints, size_t* npoints) {
  size_t pos = 0;
  size_t i;
  ZopfliBlockState s;
  size_t* lz77splitpoints = 0;
  size_t nlz77points = 0;
  ZopfliLZ77Store store;
  ZopfliHash hash;
  ZopfliHash* h = &hash;

  ZopfliInitLZ77Store(in, &store);
  ZopfliInitBlockState(options, instart, inend, 0, &s);
  ZopfliAllocHash(ZOPFLI_WINDOW_SIZE, h);

  *npoints = 0;
  *splitpoints = 0;

  /* Unintuitively, Using a simple LZ77 method here instead of ZopfliLZ77Optimal
  results in better blocks. */
  ZopfliLZ77Greedy(&s, in, instart, inend, &store, h);

  ZopfliBlockSplitLZ77(options,
                       &store, maxblocks,
                       &lz77splitpoints, &nlz77points);

  /* Convert LZ77 positions to positions in the uncompressed input. */
  pos = instart;
  if (nlz77points > 0) {
    for (i = 0; i < store.size; i++) {
      size_t length = store.dists[i] == 0 ? 1 : store.litlens[i];
      if (lz77splitpoints[*npoints] == i) {
        ZOPFLI_APPEND_DATA(pos, splitpoints, npoints);
        if (*npoints == nlz77points) break;
      }
      pos += length;
    }
  }
  assert(*npoints == nlz77points);

  free(lz77splitpoints);
  ZopfliCleanBlockState(&s);
  ZopfliCleanLZ77Store(&store);
  ZopfliCleanHash(h);
}